

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_arc.cpp
# Opt level: O0

bool __thiscall ON_Arc::Create(ON_Arc *this,ON_Circle *circle,ON_Interval angle_interval_in_radians)

{
  double dVar1;
  bool local_29;
  bool rc;
  ON_Circle *circle_local;
  ON_Arc *this_local;
  ON_Interval angle_interval_in_radians_local;
  
  memcpy(this,circle,0x80);
  ON_Plane::UpdateEquation((ON_Plane *)this);
  (this->super_ON_Circle).radius = circle->radius;
  (this->m_angle).m_t[0] = angle_interval_in_radians.m_t[0];
  (this->m_angle).m_t[1] = angle_interval_in_radians.m_t[1];
  local_29 = ON_Interval::IsDecreasing(&this->m_angle);
  if (local_29) {
    ON_Interval::Swap(&this->m_angle);
    Reverse(this);
  }
  local_29 = !local_29;
  dVar1 = ON_Interval::Length(&this->m_angle);
  if (6.283185307179586 < dVar1) {
    local_29 = false;
    (this->m_angle).m_t[1] = (this->m_angle).m_t[0] + 6.283185307179586;
  }
  if (local_29 != false) {
    local_29 = IsValid(this);
  }
  return local_29;
}

Assistant:

bool ON_Arc::Create(
  const ON_Circle& circle,
  ON_Interval angle_interval_in_radians
  )
{
  bool rc = true;
  plane = circle.plane;
  plane.UpdateEquation();
  radius = circle.radius;
  m_angle = angle_interval_in_radians;
  if ( m_angle.IsDecreasing() )
  {
    rc = false; // bogus input
    // m_angle must never be decreasing
    m_angle.Swap();
    Reverse();
  }
  if ( m_angle.Length() > 2.0*ON_PI )
  {
    rc = false; // bogus input
    m_angle.m_t[1] = m_angle.m_t[0] + 2.0*ON_PI;
  }
  if ( rc )
    rc = IsValid();
  return rc;
}